

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall amrex::FabArray<amrex::IArrayBox>::ShMem::~ShMem(ShMem *this)

{
  ShMem *this_local;
  
  return;
}

Assistant:

~ShMem () {
#if defined(BL_USE_MPI3)
            if (win != MPI_WIN_NULL) MPI_Win_free(&win);
#endif
#ifdef BL_USE_TEAM
            if (alloc) {
                amrex::update_fab_stats(-n_points, -n_values, sizeof(value_type));
            }
#endif
        }